

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_select_node.hpp
# Opt level: O3

void __thiscall duckdb::BoundSelectNode::BoundSelectNode(BoundSelectNode *this)

{
  (this->super_BoundQueryNode).type = SELECT_NODE;
  (this->super_BoundQueryNode).modifiers.
  super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_BoundQueryNode).modifiers.
  super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_BoundQueryNode).modifiers.
  super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BoundQueryNode).names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_BoundQueryNode).names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_BoundQueryNode).names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BoundQueryNode).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_BoundQueryNode).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_BoundQueryNode).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BoundQueryNode)._vptr_BoundQueryNode = (_func_int **)&PTR__BoundSelectNode_01981da8;
  (this->bind_state).alias_map._M_h._M_buckets = &(this->bind_state).alias_map._M_h._M_single_bucket
  ;
  (this->bind_state).alias_map._M_h._M_bucket_count = 1;
  (this->bind_state).alias_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bind_state).alias_map._M_h._M_element_count = 0;
  (this->bind_state).alias_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bind_state).alias_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bind_state).alias_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bind_state).projection_map._M_h._M_buckets =
       &(this->bind_state).projection_map._M_h._M_single_bucket;
  (this->bind_state).projection_map._M_h._M_bucket_count = 1;
  (this->bind_state).projection_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bind_state).projection_map._M_h._M_element_count = 0;
  (this->bind_state).projection_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bind_state).projection_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bind_state).projection_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bind_state).original_expressions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bind_state).original_expressions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bind_state).original_expressions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bind_state).referenced_aliases._M_h._M_buckets =
       &(this->bind_state).referenced_aliases._M_h._M_single_bucket;
  (this->bind_state).referenced_aliases._M_h._M_bucket_count = 1;
  (this->bind_state).referenced_aliases._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bind_state).referenced_aliases._M_h._M_element_count = 0;
  (this->bind_state).referenced_aliases._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bind_state).referenced_aliases._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bind_state).referenced_aliases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bind_state).volatile_expressions._M_h._M_buckets =
       &(this->bind_state).volatile_expressions._M_h._M_single_bucket;
  (this->bind_state).volatile_expressions._M_h._M_bucket_count = 1;
  (this->bind_state).volatile_expressions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bind_state).volatile_expressions._M_h._M_element_count = 0;
  (this->bind_state).volatile_expressions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bind_state).volatile_expressions._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bind_state).volatile_expressions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bind_state).subquery_expressions._M_h._M_buckets =
       &(this->bind_state).subquery_expressions._M_h._M_single_bucket;
  (this->bind_state).subquery_expressions._M_h._M_bucket_count = 1;
  (this->bind_state).subquery_expressions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bind_state).subquery_expressions._M_h._M_element_count = 0;
  (this->bind_state).subquery_expressions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->bound_column_count = 0;
  switchD_005681f0::default
            (&(this->bind_state).subquery_expressions._M_h._M_rehash_policy._M_next_resize,0,0x98);
  (this->aggregates).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aggregates).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aggregates).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grouping_functions).
  super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  .
  super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grouping_functions).
  super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  .
  super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grouping_functions).
  super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  .
  super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aggregate_map)._M_h._M_buckets = &(this->aggregate_map)._M_h._M_single_bucket;
  (this->aggregate_map)._M_h._M_bucket_count = 1;
  (this->aggregate_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->aggregate_map)._M_h._M_element_count = 0;
  (this->aggregate_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->aggregate_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->aggregate_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->windows).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->windows).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->windows).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unnests)._M_h._M_buckets = &(this->unnests)._M_h._M_single_bucket;
  (this->unnests)._M_h._M_bucket_count = 1;
  (this->unnests)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->unnests)._M_h._M_element_count = 0;
  (this->unnests)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->unnests)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->unnests)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->need_prune = false;
  return;
}

Assistant:

BoundSelectNode() : BoundQueryNode(QueryNodeType::SELECT_NODE) {
	}